

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void anon_unknown.dwarf_13ae29::getCurrencyLongNameData
               (Locale *locale,CurrencyUnit *currency,UnicodeString *outArray,UErrorCode *status)

{
  UnicodeString *this;
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  char16_t *currency_00;
  char *pluralCount;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UChar *local_70;
  char16_t *longName;
  int32_t longNameLen;
  UBool isChoiceFormat;
  UnicodeString *pattern;
  undefined4 local_50;
  int32_t i;
  LocalPointerBase<UResourceBundle> local_40;
  LocalUResourceBundlePointer unitsBundle;
  PluralTableSink sink;
  UErrorCode *status_local;
  UnicodeString *outArray_local;
  CurrencyUnit *currency_local;
  Locale *locale_local;
  
  PluralTableSink::PluralTableSink((PluralTableSink *)&unitsBundle,outArray);
  pcVar2 = icu_63::Locale::getName(locale);
  pUVar3 = ures_open_63("icudt63l-curr",pcVar2,status);
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_40,pUVar3);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pUVar3 = icu_63::LocalPointerBase<UResourceBundle>::getAlias(&local_40);
    ures_getAllItemsWithFallback_63
              (pUVar3,"CurrencyUnitPatterns",(ResourceSink *)&unitsBundle,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      for (pattern._4_4_ = ZERO; (int)pattern._4_4_ < 6; pattern._4_4_ = pattern._4_4_ + ONE) {
        _longNameLen = outArray + (int)pattern._4_4_;
        UVar1 = icu_63::UnicodeString::isBogus(_longNameLen);
        if (UVar1 == '\0') {
          longName._7_1_ = 0;
          longName._0_4_ = 0;
          currency_00 = icu_63::CurrencyUnit::getISOCurrency(currency);
          pcVar2 = icu_63::Locale::getName(locale);
          pluralCount = icu_63::StandardPlural::getKeyword(pattern._4_4_);
          local_70 = ucurr_getPluralName_63
                               (currency_00,pcVar2,(UBool *)((long)&longName + 7),pluralCount,
                                (int32_t *)&longName,status);
          this = _longNameLen;
          icu_63::UnicodeString::UnicodeString(&local_b0,L"{1}");
          icu_63::UnicodeString::UnicodeString(&local_f0,local_70,(int32_t)longName);
          icu_63::UnicodeString::findAndReplace(this,&local_b0,&local_f0);
          icu_63::UnicodeString::~UnicodeString(&local_f0);
          icu_63::UnicodeString::~UnicodeString(&local_b0);
        }
      }
      local_50 = 0;
    }
    else {
      local_50 = 1;
    }
  }
  else {
    local_50 = 1;
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_40);
  PluralTableSink::~PluralTableSink((PluralTableSink *)&unitsBundle);
  return;
}

Assistant:

void getCurrencyLongNameData(const Locale &locale, const CurrencyUnit &currency, UnicodeString *outArray,
                             UErrorCode &status) {
    // In ICU4J, this method gets a CurrencyData from CurrencyData.provider.
    // TODO(ICU4J): Implement this without going through CurrencyData, like in ICU4C?
    PluralTableSink sink(outArray);
    LocalUResourceBundlePointer unitsBundle(ures_open(U_ICUDATA_CURR, locale.getName(), &status));
    if (U_FAILURE(status)) { return; }
    ures_getAllItemsWithFallback(unitsBundle.getAlias(), "CurrencyUnitPatterns", sink, status);
    if (U_FAILURE(status)) { return; }
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        UnicodeString &pattern = outArray[i];
        if (pattern.isBogus()) {
            continue;
        }
        UBool isChoiceFormat = FALSE;
        int32_t longNameLen = 0;
        const char16_t *longName = ucurr_getPluralName(
                currency.getISOCurrency(),
                locale.getName(),
                &isChoiceFormat,
                StandardPlural::getKeyword(static_cast<StandardPlural::Form>(i)),
                &longNameLen,
                &status);
        // Example pattern from data: "{0} {1}"
        // Example output after find-and-replace: "{0} US dollars"
        pattern.findAndReplace(UnicodeString(u"{1}"), UnicodeString(longName, longNameLen));
    }
}